

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# theory_data.cpp
# Opt level: O1

iterator __thiscall Potassco::TheoryTerm::end(TheoryTerm *this)

{
  ulong uVar1;
  
  uVar1 = this->data_;
  if (uVar1 == 0xffffffffffffffff) {
    fail(-2,"Theory_t Potassco::TheoryTerm::type() const",0x4d,"valid()","Invalid term",0,
         0xffffffffffffffff);
  }
  if (((uint)uVar1 & 3) == 2) {
    return (iterator)
           ((uVar1 & 0xfffffffffffffffc) + (ulong)*(uint *)((uVar1 & 0xfffffffffffffffc) + 4) * 4 +
           8);
  }
  return (iterator)0x0;
}

Assistant:

Theory_t TheoryTerm::type() const { POTASSCO_REQUIRE(valid(), "Invalid term"); return static_cast<Theory_t>(data_&typeMask); }